

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpt.cpp
# Opt level: O2

void __thiscall
indigox::algorithm::TDVertScore::IntroducePropagate
          (TDVertScore *this,shared_ptr<indigox::algorithm::TDVertScore> *a)

{
  ProperScoreMatrix *this_00;
  MolVertPair v;
  _Base_ptr p_Var1;
  TDVertScore *pTVar2;
  mapped_type *this_01;
  size_type sVar3;
  mapped_type *pmVar4;
  _Rb_tree<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>,std::_Select1st<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>
  *this_02;
  mapped_type *this_03;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
  *this_04;
  _Base_ptr p_Var5;
  size_t count;
  uint local_10c;
  TDVertScore *local_108;
  shared_ptr<indigox::algorithm::TDVertScore> *local_100;
  _Base_ptr local_f8;
  BagScores tmpBags;
  BagMask iMask;
  MolVertPair introduced;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  BagMask newMask;
  
  introduced.first = (this->tdProperties->kind).second.first;
  introduced.second = (this->tdProperties->kind).second.second;
  local_100 = a;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->fMask,
             &((a->super___shared_ptr<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->fMask);
  this_01 = std::
            map<std::pair<void_*,_void_*>,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::at(&this->parent->pairMasks_,&introduced);
  sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(this_01);
  this_00 = &this->score;
  local_108 = this;
  for (iMask.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_ = this->min_e;
      (uint)iMask.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start <= local_108->max_e;
      iMask.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           (uint)iMask.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1) {
    tmpBags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    tmpBags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    tmpBags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &tmpBags._M_t._M_impl.super__Rb_tree_header._M_header;
    tmpBags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tmpBags._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         tmpBags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>,std::_Select1st<std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsig...:pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>>>
    ::
    _M_emplace_unique<unsigned_int&,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>&>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>,std::_Select1st<std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsig___:pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>>>
                *)this_00,(uint *)&iMask,
               (map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                *)&tmpBags._M_t);
    std::
    _Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
    ::~_Rb_tree(&tmpBags._M_t);
  }
  for (count = 1; pTVar2 = local_108, count <= sVar3; count = count + 1) {
    v.second = introduced.second;
    v.first = introduced.first;
    IntroduceCountToMask(&iMask,local_108,v,count);
    for (local_10c = pTVar2->min_e; local_10c <= local_108->max_e; local_10c = local_10c + 1) {
      pmVar4 = std::
               map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
               ::at(&((local_100->
                      super___shared_ptr<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->score,&local_10c);
      p_Var5 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)p_Var5 != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header) {
        local_f8 = p_Var5;
        boost::operator|(&newMask,(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  (p_Var5 + 1),&iMask);
        tmpBags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        tmpBags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tmpBags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &tmpBags._M_t._M_impl.super__Rb_tree_header._M_header;
        tmpBags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tmpBags._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             tmpBags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        this_02 = (_Rb_tree<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>,std::_Select1st<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>
                   *)std::
                     map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                     ::at(this_00,&local_10c);
        std::
        _Rb_tree<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>,std::_Select1st<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>
        ::
        _M_emplace_unique<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>&,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>&>
                  (this_02,&newMask,
                   (multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)&tmpBags);
        p_Var1 = local_f8 + 2;
        for (p_Var5 = local_f8[2]._M_right; p_Var5 != (_Base_ptr)&p_Var1->_M_parent;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          this_03 = std::
                    map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                    ::at(this_00,&local_10c);
          this_04 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
                     *)std::
                       map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                       ::at(this_03,&newMask);
          boost::operator|(&local_70,
                           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &p_Var5[1]._M_parent,&iMask);
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
          ::
          _M_emplace_equal<unsigned_int_const&,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                    (this_04,&p_Var5[1]._M_color,&local_70);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70);
        }
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     *)&tmpBags);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&newMask);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(local_f8);
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&iMask);
  }
  std::_Rb_tree<$4b2183d$>::clear
            (&(((local_100->
                super___shared_ptr<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->score)._M_t);
  return;
}

Assistant:

void TDVertScore::IntroducePropagate(std::shared_ptr<TDVertScore> a)
{
  MolVertPair introduced = tdProperties->kind.second;
  fMask = a->fMask;
  size_t count = parent->pairMasks_.at(introduced).count();
  for (uint32_t e = min_e; e <= max_e; ++e) {
    BagScores tmpBags;
    score.emplace(e, tmpBags);
  }
  
  for (size_t i = 1; i <= count; ++i) {
    BagMask iMask = IntroduceCountToMask(introduced, i);
    for (uint32_t e = min_e; e <= max_e; ++e) {
      for (auto& bmask : a->score.at(e)) {
        BagMask newMask = bmask.first | iMask;
        MaskScores tmpScores;
        score.at(e).emplace(newMask, tmpScores);
        for (auto& ms : bmask.second) {
          score.at(e).at(newMask).emplace(ms.first, ms.second | iMask);
        }
      }
    }
  }
  a->score.clear();
}